

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O3

void * MemoryEditor::EndianessCopyBigEndian(void *_dst,void *_src,size_t s,int is_little_endian)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (is_little_endian != 0) {
    if (0 < (int)s) {
      lVar3 = (long)_src + -1;
      lVar2 = 0;
      do {
        *(undefined1 *)((long)_dst + lVar2) = *(undefined1 *)(lVar3 + s);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + -1;
      } while ((int)s != (int)lVar2);
    }
    return _dst;
  }
  pvVar1 = memcpy(_dst,_src,s);
  return pvVar1;
}

Assistant:

static void* EndianessCopyBigEndian(void* _dst, void* _src, size_t s, int is_little_endian)
    {
        if (is_little_endian)
        {
            uint8_t* dst = (uint8_t*)_dst;
            uint8_t* src = (uint8_t*)_src + s - 1;
            for (int i = 0, n = (int)s; i < n; ++i)
                memcpy(dst++, src--, 1);
            return _dst;
        }
        else
        {
            return memcpy(_dst, _src, s);
        }
    }